

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_info_cert_type(char **buf,size_t *size,uchar ns_cert_type)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  char *__s;
  ulong __maxlen;
  bool bVar4;
  
  __maxlen = *size;
  __s = *buf;
  if ((char)ns_cert_type < '\0') {
    uVar1 = snprintf(__s,__maxlen,"%sSSL Client",anon_var_dwarf_da49 + 9);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  else {
    pcVar2 = anon_var_dwarf_da49 + 9;
  }
  if ((ns_cert_type & 0x40) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sSSL Server",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((ns_cert_type & 0x20) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sEmail",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((ns_cert_type & 0x10) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sObject Signing",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((ns_cert_type & 8) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sReserved",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((ns_cert_type & 4) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sSSL CA",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((ns_cert_type & 2) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sEmail CA",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((ns_cert_type & 1) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sObject Signing CA",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
  }
  *size = __maxlen;
  *buf = __s;
  return 0;
}

Assistant:

static int x509_info_cert_type( char **buf, size_t *size,
                                unsigned char ns_cert_type )
{
    int ret;
    size_t n = *size;
    char *p = *buf;
    const char *sep = "";

    CERT_TYPE( MBEDTLS_X509_NS_CERT_TYPE_SSL_CLIENT,         "SSL Client" );
    CERT_TYPE( MBEDTLS_X509_NS_CERT_TYPE_SSL_SERVER,         "SSL Server" );
    CERT_TYPE( MBEDTLS_X509_NS_CERT_TYPE_EMAIL,              "Email" );
    CERT_TYPE( MBEDTLS_X509_NS_CERT_TYPE_OBJECT_SIGNING,     "Object Signing" );
    CERT_TYPE( MBEDTLS_X509_NS_CERT_TYPE_RESERVED,           "Reserved" );
    CERT_TYPE( MBEDTLS_X509_NS_CERT_TYPE_SSL_CA,             "SSL CA" );
    CERT_TYPE( MBEDTLS_X509_NS_CERT_TYPE_EMAIL_CA,           "Email CA" );
    CERT_TYPE( MBEDTLS_X509_NS_CERT_TYPE_OBJECT_SIGNING_CA,  "Object Signing CA" );

    *size = n;
    *buf = p;

    return( 0 );
}